

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5PreciseQualifier.cpp
# Opt level: O2

void __thiscall glcts::GPUShader5PreciseQualifier::deinit(GPUShader5PreciseQualifier *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x518))(0);
  (**(code **)(lVar2 + 0x518))(1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  (**(code **)(lVar2 + 0xd8))(0);
  if (this->m_program_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_program_id = 0;
  }
  if (this->m_vertex_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vertex_shader_id = 0;
  }
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fragment_shader_id = 0;
  }
  if (this->m_tf_buffer_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_tf_buffer_id);
    this->m_tf_buffer_id = 0;
  }
  if (this->m_vertex_positions_buffer_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_vertex_positions_buffer_id);
    this->m_vertex_positions_buffer_id = 0;
  }
  if (this->m_vertex_weights_buffer_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_vertex_weights_buffer_id);
    this->m_vertex_weights_buffer_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GPUShader5PreciseQualifier::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.disableVertexAttribArray(0);
	gl.disableVertexAttribArray(1);
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindVertexArray(0);

	/* Delete program object and shaders */
	if (m_program_id != 0)
	{
		gl.deleteProgram(m_program_id);

		m_program_id = 0;
	}

	if (m_vertex_shader_id != 0)
	{
		gl.deleteShader(m_vertex_shader_id);

		m_vertex_shader_id = 0;
	}

	if (m_fragment_shader_id != 0)
	{
		gl.deleteShader(m_fragment_shader_id);

		m_fragment_shader_id = 0;
	}

	/* Delete buffer objects */
	if (m_tf_buffer_id != 0)
	{
		gl.deleteBuffers(1, &m_tf_buffer_id);

		m_tf_buffer_id = 0;
	}

	if (m_vertex_positions_buffer_id != 0)
	{
		gl.deleteBuffers(1, &m_vertex_positions_buffer_id);

		m_vertex_positions_buffer_id = 0;
	}

	if (m_vertex_weights_buffer_id != 0)
	{
		gl.deleteBuffers(1, &m_vertex_weights_buffer_id);

		m_vertex_weights_buffer_id = 0;
	}

	/* Delete vertex array object */
	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	/* Call base class' deinit() */
	TestCaseBase::deinit();
}